

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ImplicitCallFlags flags;
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Var pvVar3;
  JavascriptArray *array;
  Var index;
  Var local_38;
  Var element;
  Var instance;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar2 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar2);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  bVar1 = TaggedNumber::Is(pvVar3);
  if ((bVar1) || (bVar1 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(pvVar3), !bVar1)) {
    index = GetReg<unsigned_int>(this,playout->Element);
    pSVar2 = GetScriptContext(this);
    local_38 = Js::JavascriptOperators::OP_GetElementI(pvVar3,index,pSVar2);
  }
  else {
    array = UnsafeVarTo<Js::JavascriptArray>(pvVar3);
    pvVar3 = GetReg<unsigned_int>(this,playout->Element);
    pSVar2 = GetScriptContext(this);
    local_38 = ProfilingHelpers::ProfiledLdElem_FastPath(array,pvVar3,pSVar2,(LdElemInfo *)0x0);
  }
  ClearFlags(this,0x10);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  SetReg<unsigned_int>(this,playout->Value,local_38);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetElementI(const unaligned T* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Same fast path as in the backend.

        Var instance = GetReg(playout->Instance);

        // Only enable fast path if the javascript array is not cross site
        Var element;
#if ENABLE_PROFILE_INFO
        if (!TaggedNumber::Is(instance) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(instance))
        {
            element =
                ProfilingHelpers::ProfiledLdElem_FastPath(
                    UnsafeVarTo<JavascriptArray>(instance),
                    GetReg(playout->Element),
                    GetScriptContext());
        }
        else
#endif
        {
            element = JavascriptOperators::OP_GetElementI(instance, GetReg(playout->Element), GetScriptContext());
        }

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->Value, element);
    }